

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_texshader.cpp
# Opt level: O0

void __thiscall FShaderLayer::FShaderLayer(FShaderLayer *this,FShaderLayer *layer)

{
  float fVar1;
  bool bVar2;
  bool bVar3;
  undefined2 uVar4;
  FShaderLayer *this_00;
  FShaderLayer *layer_local;
  FShaderLayer *this_local;
  
  FTextureID::FTextureID(&this->texture);
  FCycler::FCycler(&this->adjustX);
  FCycler::FCycler(&this->adjustY);
  FCycler::FCycler(&this->vectorX);
  FCycler::FCycler(&this->vectorY);
  FCycler::FCycler(&this->scaleX);
  FCycler::FCycler(&this->scaleY);
  FCycler::FCycler(&this->alpha);
  FCycler::FCycler(&this->r);
  FCycler::FCycler(&this->g);
  FCycler::FCycler(&this->b);
  FCycler::FCycler(&this->srcFactor);
  FCycler::FCycler(&this->dstFactor);
  (this->texture).texnum = (layer->texture).texnum;
  this->animate = (bool)(layer->animate & 1);
  this->emissive = (bool)(layer->emissive & 1);
  fVar1 = (layer->adjustX).m_end;
  (this->adjustX).m_start = (layer->adjustX).m_start;
  (this->adjustX).m_end = fVar1;
  fVar1 = (layer->adjustX).m_time;
  (this->adjustX).m_current = (layer->adjustX).m_current;
  (this->adjustX).m_time = fVar1;
  bVar2 = (layer->adjustX).m_increment;
  bVar3 = (layer->adjustX).m_shouldCycle;
  uVar4 = *(undefined2 *)&(layer->adjustX).field_0x16;
  (this->adjustX).m_cycle = (layer->adjustX).m_cycle;
  (this->adjustX).m_increment = bVar2;
  (this->adjustX).m_shouldCycle = bVar3;
  *(undefined2 *)&(this->adjustX).field_0x16 = uVar4;
  (this->adjustX).m_cycleType = (layer->adjustX).m_cycleType;
  fVar1 = (layer->adjustY).m_end;
  (this->adjustY).m_start = (layer->adjustY).m_start;
  (this->adjustY).m_end = fVar1;
  fVar1 = (layer->adjustY).m_time;
  (this->adjustY).m_current = (layer->adjustY).m_current;
  (this->adjustY).m_time = fVar1;
  bVar2 = (layer->adjustY).m_increment;
  bVar3 = (layer->adjustY).m_shouldCycle;
  uVar4 = *(undefined2 *)&(layer->adjustY).field_0x16;
  (this->adjustY).m_cycle = (layer->adjustY).m_cycle;
  (this->adjustY).m_increment = bVar2;
  (this->adjustY).m_shouldCycle = bVar3;
  *(undefined2 *)&(this->adjustY).field_0x16 = uVar4;
  (this->adjustY).m_cycleType = (layer->adjustY).m_cycleType;
  this->blendFuncSrc = layer->blendFuncSrc;
  this->blendFuncDst = layer->blendFuncDst;
  this->offsetX = layer->offsetX;
  this->offsetY = layer->offsetY;
  this->centerX = layer->centerX;
  this->centerY = layer->centerX;
  this->rotate = layer->rotate;
  this->rotation = layer->rotation;
  fVar1 = (layer->scaleX).m_end;
  (this->scaleX).m_start = (layer->scaleX).m_start;
  (this->scaleX).m_end = fVar1;
  fVar1 = (layer->scaleX).m_time;
  (this->scaleX).m_current = (layer->scaleX).m_current;
  (this->scaleX).m_time = fVar1;
  bVar2 = (layer->scaleX).m_increment;
  bVar3 = (layer->scaleX).m_shouldCycle;
  uVar4 = *(undefined2 *)&(layer->scaleX).field_0x16;
  (this->scaleX).m_cycle = (layer->scaleX).m_cycle;
  (this->scaleX).m_increment = bVar2;
  (this->scaleX).m_shouldCycle = bVar3;
  *(undefined2 *)&(this->scaleX).field_0x16 = uVar4;
  (this->scaleX).m_cycleType = (layer->scaleX).m_cycleType;
  fVar1 = (layer->scaleY).m_end;
  (this->scaleY).m_start = (layer->scaleY).m_start;
  (this->scaleY).m_end = fVar1;
  fVar1 = (layer->scaleY).m_time;
  (this->scaleY).m_current = (layer->scaleY).m_current;
  (this->scaleY).m_time = fVar1;
  bVar2 = (layer->scaleY).m_increment;
  bVar3 = (layer->scaleY).m_shouldCycle;
  uVar4 = *(undefined2 *)&(layer->scaleY).field_0x16;
  (this->scaleY).m_cycle = (layer->scaleY).m_cycle;
  (this->scaleY).m_increment = bVar2;
  (this->scaleY).m_shouldCycle = bVar3;
  *(undefined2 *)&(this->scaleY).field_0x16 = uVar4;
  (this->scaleY).m_cycleType = (layer->scaleY).m_cycleType;
  fVar1 = (layer->vectorX).m_end;
  (this->vectorX).m_start = (layer->vectorX).m_start;
  (this->vectorX).m_end = fVar1;
  fVar1 = (layer->vectorX).m_time;
  (this->vectorX).m_current = (layer->vectorX).m_current;
  (this->vectorX).m_time = fVar1;
  bVar2 = (layer->vectorX).m_increment;
  bVar3 = (layer->vectorX).m_shouldCycle;
  uVar4 = *(undefined2 *)&(layer->vectorX).field_0x16;
  (this->vectorX).m_cycle = (layer->vectorX).m_cycle;
  (this->vectorX).m_increment = bVar2;
  (this->vectorX).m_shouldCycle = bVar3;
  *(undefined2 *)&(this->vectorX).field_0x16 = uVar4;
  (this->vectorX).m_cycleType = (layer->vectorX).m_cycleType;
  fVar1 = (layer->vectorY).m_end;
  (this->vectorY).m_start = (layer->vectorY).m_start;
  (this->vectorY).m_end = fVar1;
  fVar1 = (layer->vectorY).m_time;
  (this->vectorY).m_current = (layer->vectorY).m_current;
  (this->vectorY).m_time = fVar1;
  bVar2 = (layer->vectorY).m_increment;
  bVar3 = (layer->vectorY).m_shouldCycle;
  uVar4 = *(undefined2 *)&(layer->vectorY).field_0x16;
  (this->vectorY).m_cycle = (layer->vectorY).m_cycle;
  (this->vectorY).m_increment = bVar2;
  (this->vectorY).m_shouldCycle = bVar3;
  *(undefined2 *)&(this->vectorY).field_0x16 = uVar4;
  (this->vectorY).m_cycleType = (layer->vectorY).m_cycleType;
  fVar1 = (layer->alpha).m_end;
  (this->alpha).m_start = (layer->alpha).m_start;
  (this->alpha).m_end = fVar1;
  fVar1 = (layer->alpha).m_time;
  (this->alpha).m_current = (layer->alpha).m_current;
  (this->alpha).m_time = fVar1;
  bVar2 = (layer->alpha).m_increment;
  bVar3 = (layer->alpha).m_shouldCycle;
  uVar4 = *(undefined2 *)&(layer->alpha).field_0x16;
  (this->alpha).m_cycle = (layer->alpha).m_cycle;
  (this->alpha).m_increment = bVar2;
  (this->alpha).m_shouldCycle = bVar3;
  *(undefined2 *)&(this->alpha).field_0x16 = uVar4;
  (this->alpha).m_cycleType = (layer->alpha).m_cycleType;
  fVar1 = (layer->r).m_end;
  (this->r).m_start = (layer->r).m_start;
  (this->r).m_end = fVar1;
  fVar1 = (layer->r).m_time;
  (this->r).m_current = (layer->r).m_current;
  (this->r).m_time = fVar1;
  bVar2 = (layer->r).m_increment;
  bVar3 = (layer->r).m_shouldCycle;
  uVar4 = *(undefined2 *)&(layer->r).field_0x16;
  (this->r).m_cycle = (layer->r).m_cycle;
  (this->r).m_increment = bVar2;
  (this->r).m_shouldCycle = bVar3;
  *(undefined2 *)&(this->r).field_0x16 = uVar4;
  (this->r).m_cycleType = (layer->r).m_cycleType;
  fVar1 = (layer->g).m_end;
  (this->g).m_start = (layer->g).m_start;
  (this->g).m_end = fVar1;
  fVar1 = (layer->g).m_time;
  (this->g).m_current = (layer->g).m_current;
  (this->g).m_time = fVar1;
  bVar2 = (layer->g).m_increment;
  bVar3 = (layer->g).m_shouldCycle;
  uVar4 = *(undefined2 *)&(layer->g).field_0x16;
  (this->g).m_cycle = (layer->g).m_cycle;
  (this->g).m_increment = bVar2;
  (this->g).m_shouldCycle = bVar3;
  *(undefined2 *)&(this->g).field_0x16 = uVar4;
  (this->g).m_cycleType = (layer->g).m_cycleType;
  fVar1 = (layer->b).m_end;
  (this->b).m_start = (layer->b).m_start;
  (this->b).m_end = fVar1;
  fVar1 = (layer->b).m_time;
  (this->b).m_current = (layer->b).m_current;
  (this->b).m_time = fVar1;
  bVar2 = (layer->b).m_increment;
  bVar3 = (layer->b).m_shouldCycle;
  uVar4 = *(undefined2 *)&(layer->b).field_0x16;
  (this->b).m_cycle = (layer->b).m_cycle;
  (this->b).m_increment = bVar2;
  (this->b).m_shouldCycle = bVar3;
  *(undefined2 *)&(this->b).field_0x16 = uVar4;
  (this->b).m_cycleType = (layer->b).m_cycleType;
  this->flags = layer->flags;
  if (layer->layerMask == (FShaderLayer *)0x0) {
    this->layerMask = (FShaderLayer *)0x0;
  }
  else {
    this_00 = (FShaderLayer *)operator_new(0x188);
    FShaderLayer(this_00,layer->layerMask);
    this->layerMask = this_00;
  }
  this->texgen = layer->texgen;
  this->warp = layer->warp;
  this->warpspeed = layer->warpspeed;
  return;
}

Assistant:

FShaderLayer::FShaderLayer(const FShaderLayer &layer)
{
	texture = layer.texture;
	animate = layer.animate;
	emissive = layer.emissive;
	adjustX = layer.adjustX;
	adjustY = layer.adjustY;
	blendFuncSrc = layer.blendFuncSrc;
	blendFuncDst = layer.blendFuncDst;
	offsetX = layer.offsetX;
	offsetY = layer.offsetY;
	centerX = layer.centerX;
	centerY = layer.centerX;
	rotate = layer.rotate;
	rotation = layer.rotation;
	scaleX = layer.scaleX;
	scaleY = layer.scaleY;
	vectorX = layer.vectorX;
	vectorY = layer.vectorY;
	alpha = layer.alpha;
	r = layer.r;
	g = layer.g;
	b = layer.b;
	flags = layer.flags;
	if (layer.layerMask)
	{
		layerMask = new FShaderLayer(*(layer.layerMask));
	}
	else
	{
		layerMask = NULL;
	}
	texgen = layer.texgen;
	warp = layer.warp;
	warpspeed = layer.warpspeed;
}